

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O0

float __thiscall Json::Value::asFloat(Value *this)

{
  float local_1dc;
  float local_1d4;
  string local_1c0;
  ostringstream local_190 [8];
  ostringstream oss;
  Value *this_local;
  
  switch(this->field_0x8) {
  case 0:
    this_local._4_4_ = 0.0;
    break;
  case 1:
    this_local._4_4_ = (float)(this->value_).int_;
    break;
  case 2:
    local_1d4 = (float)(this->value_).uint_;
    this_local._4_4_ = local_1d4;
    break;
  case 3:
    this_local._4_4_ = (float)(this->value_).real_;
    break;
  default:
    std::__cxx11::ostringstream::ostringstream(local_190);
    std::operator<<((ostream *)local_190,"Value is not convertible to float.");
    std::__cxx11::ostringstream::str();
    throwLogicError(&local_1c0);
  case 5:
    local_1dc = 1.0;
    if (((this->value_).bool_ & 1U) == 0) {
      local_1dc = 0.0;
    }
    this_local._4_4_ = local_1dc;
  }
  return this_local._4_4_;
}

Assistant:

float Value::asFloat() const {
  switch (type_) {
  case intValue:
    return static_cast<float>(value_.int_);
  case uintValue:
#if !defined(JSON_USE_INT64_DOUBLE_CONVERSION)
    return static_cast<float>(value_.uint_);
#else  // if !defined(JSON_USE_INT64_DOUBLE_CONVERSION)
    // This can fail (silently?) if the value is bigger than MAX_FLOAT.
    return static_cast<float>(integerToDouble(value_.uint_));
#endif // if !defined(JSON_USE_INT64_DOUBLE_CONVERSION)
  case realValue:
    return static_cast<float>(value_.real_);
  case nullValue:
    return 0.0;
  case booleanValue:
    return value_.bool_ ? 1.0f : 0.0f;
  default:
    break;
  }
  JSON_FAIL_MESSAGE("Value is not convertible to float.");
}